

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HAPI.cpp
# Opt level: O0

void solve_fromArrays_dense
               (int *probStatus,int *basisStatus,int XnumCol,int XnumRow,int XobjSense,
               int XobjOffset,double *XcolCost,double *XcolLower,double *XcolUpper,double *XrowLower
               ,double *XrowUpper,double *XAmatrix,double *colPrimalValues,double *colDualValues,
               double *rowPrimalValues,double *rowDualValues,int *basicVariables)

{
  double dVar1;
  void *pvVar2;
  void *pvVar3;
  undefined4 *puVar4;
  int in_ECX;
  int in_EDX;
  long in_stack_00000030;
  double r_v_1;
  int r_n_1;
  int el_n;
  int c_n_1;
  double r_v;
  int r_n;
  int c_n;
  int XnumNz;
  int *XAindex;
  int *XAstart;
  double *XAvalue;
  int in_stack_00015c80;
  int in_stack_00015c84;
  int in_stack_00015c88;
  int in_stack_00015c8c;
  int *in_stack_00015c90;
  int *in_stack_00015c98;
  int in_stack_00015cd0;
  double *in_stack_00015cd8;
  double *in_stack_00015ce0;
  double *in_stack_00015ce8;
  double *in_stack_00015cf0;
  double *in_stack_00015cf8;
  int *in_stack_00015d00;
  int *in_stack_00015d08;
  double *in_stack_00015d10;
  double *in_stack_00015d18;
  double *in_stack_00015d20;
  double *in_stack_00015d28;
  double *in_stack_00015d30;
  int *in_stack_00015d38;
  int local_8c;
  int local_88;
  int local_84;
  int local_74;
  int local_70;
  int local_6c;
  
  local_6c = 0;
  for (local_70 = 0; local_70 < in_EDX; local_70 = local_70 + 1) {
    for (local_74 = 0; local_74 < in_ECX; local_74 = local_74 + 1) {
      dVar1 = *(double *)(in_stack_00000030 + (long)(local_74 + local_70 * in_ECX) * 8);
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        local_6c = local_6c + 1;
      }
    }
  }
  pvVar2 = malloc((long)local_6c << 3);
  pvVar3 = malloc((long)local_6c << 2);
  puVar4 = (undefined4 *)malloc((long)(in_EDX + 1) << 2);
  *puVar4 = 0;
  for (local_84 = 0; local_84 < in_EDX; local_84 = local_84 + 1) {
    local_88 = puVar4[local_84];
    for (local_8c = 0; local_8c < in_ECX; local_8c = local_8c + 1) {
      dVar1 = *(double *)(in_stack_00000030 + (long)(local_8c + local_84 * in_ECX) * 8);
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        *(int *)((long)pvVar3 + (long)local_88 * 4) = local_8c;
        *(double *)((long)pvVar2 + (long)local_88 * 8) = dVar1;
        local_88 = local_88 + 1;
      }
    }
    puVar4[local_84 + 1] = local_88;
  }
  solve_fromArrays(in_stack_00015c98,in_stack_00015c90,in_stack_00015c8c,in_stack_00015c88,
                   in_stack_00015c84,in_stack_00015c80,in_stack_00015cd0,in_stack_00015cd8,
                   in_stack_00015ce0,in_stack_00015ce8,in_stack_00015cf0,in_stack_00015cf8,
                   in_stack_00015d00,in_stack_00015d08,in_stack_00015d10,in_stack_00015d18,
                   in_stack_00015d20,in_stack_00015d28,in_stack_00015d30,in_stack_00015d38);
  return;
}

Assistant:

void solve_fromArrays_dense(int* probStatus, int* basisStatus,
		      const int XnumCol, const int XnumRow, 
		      const int XobjSense, const int XobjOffset,
		      const double* XcolCost, const double* XcolLower, const double* XcolUpper,
		      const double* XrowLower, const double* XrowUpper,
		      const double* XAmatrix,
		      double* colPrimalValues, double* colDualValues,
		      double* rowPrimalValues, double* rowDualValues,
		      int* basicVariables) {
  double* XAvalue;
  int* XAstart;
  int* XAindex;
  int XnumNz=0;
  for (int c_n = 0; c_n<XnumCol; c_n++) {
    for (int r_n = 0; r_n<XnumRow; r_n++) {
      double r_v = XAmatrix[r_n+c_n*XnumRow];
      if (r_v != 0) XnumNz++;
    }
  }
  XAvalue = (double *) malloc(sizeof(double)*XnumNz);
  XAindex = (int *) malloc(sizeof(int)*XnumNz);
  XAstart = (int *) malloc(sizeof(int)*(XnumCol+1));
  XAstart[0] = 0;
  for (int c_n = 0; c_n<XnumCol; c_n++) {
    int el_n = XAstart[c_n];
    for (int r_n = 0; r_n<XnumRow; r_n++) {
      double r_v = XAmatrix[r_n+c_n*XnumRow];
      if (r_v != 0) {
  	XAindex[el_n] = r_n;
  	XAvalue[el_n] = r_v;
  	el_n++;
      }
    }
    XAstart[c_n+1] = el_n;
  }
  solve_fromArrays(probStatus, basisStatus,
		   XnumCol, XnumRow, XnumNz, 
		   XobjSense, XobjOffset,
		   XcolCost, XcolLower, XcolUpper,
		   XrowLower, XrowUpper,
		   XAstart, XAindex, XAvalue,
		   colPrimalValues, colDualValues,
		   rowPrimalValues, rowDualValues,
		   basicVariables);
}